

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::IsZeroTransformation(ON_Xform *this,double tol)

{
  bool bVar1;
  bool local_33;
  int local_24;
  int local_20;
  int j;
  int i;
  bool rc;
  double tol_local;
  ON_Xform *this_local;
  
  bVar1 = true;
  for (local_20 = 0; bVar1 && local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; bVar1 && local_24 < 4; local_24 = local_24 + 1) {
      if ((local_20 != 3) || (local_24 != 3)) {
        bVar1 = ABS(this->m_xform[local_20][local_24]) <= tol;
      }
    }
  }
  local_33 = false;
  if (bVar1) {
    local_33 = this->m_xform[3][3] == 1.0;
  }
  return local_33;
}

Assistant:

bool ON_Xform::IsZeroTransformation(double tol) const
{
	bool rc = true;
	for(int i=0; rc && i<4; i++)
		for (int j = 0; rc && j < 4; j++)
		{
			if (i == 3 && j == 3)
				continue;
			rc = fabs(m_xform[i][j]) <= tol;
		}
  return (rc && 1.0 == m_xform[3][3] );
}